

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_compressBegin_advanced
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_parameters params,
                 unsigned_long_long pledgedSrcSize)

{
  ZSTD_format_e ZVar1;
  ZSTD_CCtx_params params_00;
  ZSTD_parameters ZVar2;
  size_t sVar3;
  long lVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  byte bVar7;
  undefined8 uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  undefined1 auVar12 [12];
  undefined1 auVar13 [24];
  undefined1 in_stack_fffffffffffffeb4 [100];
  undefined1 auVar14 [24];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  uint local_98;
  ZSTD_strategy ZStack_94;
  ZSTD_frameParameters ZStack_90;
  undefined4 local_84;
  undefined1 local_80 [80];
  
  ZVar2 = params;
  bVar7 = 0;
  ZVar1 = (cctx->requestedParams).format;
  memcpy(local_80,&(cctx->requestedParams).forceWindow,0x50);
  local_b0 = CONCAT44(params.cParams.windowLog,ZVar1);
  local_a8 = params.cParams._4_8_;
  uStack_a0 = params.cParams._12_8_;
  ZStack_90.noDictIDFlag = params.fParams.noDictIDFlag;
  local_98 = params.cParams.targetLength;
  ZStack_94 = params.cParams.strategy;
  ZStack_90.contentSizeFlag = params.fParams.contentSizeFlag;
  ZStack_90.checksumFlag = params.fParams.checksumFlag;
  local_84 = 3;
  uVar11 = ZVar2.cParams.minMatch;
  uVar8 = ZVar2.cParams._0_8_;
  uVar9 = ZVar2.cParams.hashLog;
  uVar10 = ZVar2.cParams.searchLog;
  sVar3 = ZSTD_checkCParams(ZVar2.cParams);
  if (sVar3 < 0xffffffffffffff89) {
    puVar5 = &local_b0;
    puVar6 = (undefined8 *)&stack0xfffffffffffffe98;
    for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
      *puVar6 = *puVar5;
      puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
      puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
    }
    params_00.cParams.chainLog = uVar9;
    params_00.format = (int)uVar8;
    params_00.cParams.windowLog = (int)((ulong)uVar8 >> 0x20);
    params_00.cParams.hashLog = uVar10;
    params_00.cParams.searchLog = uVar11;
    params_00.cParams.minMatch = params.cParams.targetLength;
    params_00.cParams.targetLength = params.cParams.strategy;
    auVar12 = in_stack_fffffffffffffeb4._4_12_;
    auVar13 = in_stack_fffffffffffffeb4._52_24_;
    auVar14 = in_stack_fffffffffffffeb4._76_24_;
    params_00.cParams.strategy = in_stack_fffffffffffffeb4._0_4_;
    params_00.fParams.contentSizeFlag = auVar12._0_4_;
    params_00.fParams.checksumFlag = auVar12._4_4_;
    params_00.fParams.noDictIDFlag = auVar12._8_4_;
    params_00.compressionLevel = in_stack_fffffffffffffeb4._16_4_;
    params_00.forceWindow = in_stack_fffffffffffffeb4._20_4_;
    params_00.attachDictPref = in_stack_fffffffffffffeb4._24_4_;
    params_00.nbWorkers = in_stack_fffffffffffffeb4._28_4_;
    params_00._60_4_ = in_stack_fffffffffffffeb4._32_4_;
    params_00.jobSize = in_stack_fffffffffffffeb4._36_8_;
    params_00.overlapLog = in_stack_fffffffffffffeb4._44_4_;
    params_00.rsyncable = in_stack_fffffffffffffeb4._48_4_;
    params_00.ldmParams.enableLdm = auVar13._0_4_;
    params_00.ldmParams.hashLog = auVar13._4_4_;
    params_00.ldmParams.bucketSizeLog = auVar13._8_4_;
    params_00.ldmParams.minMatchLength = auVar13._12_4_;
    params_00.ldmParams.hashRateLog = auVar13._16_4_;
    params_00.ldmParams.windowLog = auVar13._20_4_;
    params_00.customMem.customAlloc = (ZSTD_allocFunction)auVar14._0_8_;
    params_00.customMem.customFree = (ZSTD_freeFunction)auVar14._8_8_;
    params_00.customMem.opaque = (void *)auVar14._16_8_;
    sVar3 = ZSTD_compressBegin_internal
                      (cctx,dict,dictSize,ZSTD_dct_auto,ZSTD_dtlm_fast,(ZSTD_CDict *)0x0,params_00,
                       pledgedSrcSize,ZSTDb_not_buffered);
  }
  return sVar3;
}

Assistant:

size_t ZSTD_compressBegin_advanced(ZSTD_CCtx* cctx,
                             const void* dict, size_t dictSize,
                                   ZSTD_parameters params, unsigned long long pledgedSrcSize)
{
    ZSTD_CCtx_params const cctxParams =
            ZSTD_assignParamsToCCtxParams(cctx->requestedParams, params);
    return ZSTD_compressBegin_advanced_internal(cctx,
                                            dict, dictSize, ZSTD_dct_auto, ZSTD_dtlm_fast,
                                            NULL /*cdict*/,
                                            cctxParams, pledgedSrcSize);
}